

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O0

char decLuhnCalc(char *dec)

{
  size_t sVar1;
  long in_RDI;
  size_t i;
  word cd;
  size_t local_18;
  ulong local_10;
  
  local_10 = 0;
  sVar1 = strLen((char *)0x1165ec);
  while (local_18 = sVar1, sVar1 = local_18 - 1, local_18 != 0) {
    local_10 = luhn_table[*(char *)(in_RDI + sVar1) + -0x30] + local_10;
    if (sVar1 != 0) {
      local_10 = (long)(*(char *)(in_RDI + -1 + sVar1) + -0x30) + local_10;
      sVar1 = local_18 - 2;
    }
  }
  return (char)(((local_10 % 10) * 9) % 10) + '0';
}

Assistant:

char decLuhnCalc(const char* dec)
{
	register word cd = 0;
	size_t i;
	ASSERT(decIsValid(dec));
	for (i = strLen(dec); i--;) 
	{
		cd += luhn_table[dec[i] - '0'];
		if (i)
			cd += dec[--i] - '0';
	}
	cd %= 10, cd = ((cd << 3) + cd) % 10;
	return (char)cd + '0';
}